

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O1

void test_rep_ctx_recv_aio_stopped(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_socket local_38;
  nng_ctx local_34;
  nng_socket rep;
  nng_ctx ctx;
  nng_aio *aio;
  
  nVar1 = nng_rep0_open(&local_38);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x172,"%s: expected success, got %s (%d)","nng_rep0_open(&rep)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_aio_alloc((nng_aio **)&rep,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x173,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio, NULL, NULL)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_ctx_open(&local_34,local_38);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x174,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx, rep)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        nng_aio_stop(_rep);
        nng_ctx_recv(local_34,_rep);
        nng_aio_wait(_rep);
        nVar1 = nng_aio_result(_rep);
        pcVar3 = nng_strerror(NNG_ESTOPPED);
        acutest_check_((uint)(nVar1 == NNG_ESTOPPED),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                       ,0x179,"%s fails with %s","nng_aio_result(aio)",pcVar3);
        pcVar3 = nng_strerror(NNG_ESTOPPED);
        pcVar4 = nng_strerror(nVar1);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,999,pcVar4
                         ,(ulong)nVar1);
        nVar1 = nng_ctx_close(local_34);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x17a,"%s: expected success, got %s (%d)","nng_ctx_close(ctx)",
                               pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_close(local_38);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x17b,"%s: expected success, got %s (%d)","nng_socket_close(rep)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            nng_aio_free(_rep);
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_rep_ctx_recv_aio_stopped(void)
{
	nng_socket rep;
	nng_ctx    ctx;
	nng_aio   *aio;

	NUTS_PASS(nng_rep0_open(&rep));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	NUTS_PASS(nng_ctx_open(&ctx, rep));

	nng_aio_stop(aio);
	nng_ctx_recv(ctx, aio);
	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ESTOPPED);
	NUTS_PASS(nng_ctx_close(ctx));
	NUTS_CLOSE(rep);
	nng_aio_free(aio);
}